

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

qsizetype QtPrivate::indexOf<QAction*,QPointer<QAction>>
                    (QList<QAction_*> *vector,QPointer<QAction> *u,qsizetype from)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  qsizetype qVar5;
  QAction **lhs;
  long lVar6;
  
  uVar1 = (vector->d).size;
  uVar3 = from;
  if (from < 0) {
    uVar3 = from + uVar1;
    if ((long)(from + uVar1) < 1) {
      uVar3 = 0;
    }
  }
  qVar5 = -1;
  if (uVar3 < uVar1) {
    lhs = (vector->d).ptr + uVar3;
    lVar4 = 8 - (long)lhs;
    lVar6 = uVar1 * 8 + uVar3 * -8;
    do {
      if (lVar6 == 0) {
        return -1;
      }
      bVar2 = ::operator==(lhs,u);
      lVar4 = lVar4 + -8;
      lhs = lhs + 1;
      lVar6 = lVar6 + -8;
    } while (!bVar2);
    qVar5 = -(lVar4 + (long)(vector->d).ptr) >> 3;
  }
  return qVar5;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}